

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.h
# Opt level: O2

void __thiscall
wallet::DescriptorScriptPubKeyMan::DescriptorScriptPubKeyMan
          (DescriptorScriptPubKeyMan *this,WalletStorage *storage,int64_t keypool_size)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ScriptPubKeyMan::ScriptPubKeyMan(&this->super_ScriptPubKeyMan,storage);
  (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan =
       (_func_int **)&PTR__DescriptorScriptPubKeyMan_01146fe8;
  p_Var1 = &(this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header;
  (this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_map_script_pub_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header;
  (this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_map_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_max_cached_index = -1;
  p_Var1 = &(this->m_map_keys)._M_t._M_impl.super__Rb_tree_header;
  (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  p_Var1 = &(this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header;
  (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_decryption_thoroughly_checked = false;
  this->m_keypool_size = keypool_size;
  (this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  WalletDescriptor::WalletDescriptor(&this->m_wallet_descriptor);
  *(undefined8 *)
   ((long)&(this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 0x10) =
       0;
  (this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  (this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  (this->cs_desc_man).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

DescriptorScriptPubKeyMan(WalletStorage& storage, int64_t keypool_size)
        :   ScriptPubKeyMan(storage),
            m_keypool_size(keypool_size)
        {}